

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interp.cc
# Opt level: O0

void ParseOptions(int argc,char **argv)

{
  anon_class_1_0_00000001 local_209;
  Callback local_208;
  allocator local_1e1;
  string local_1e0;
  anon_class_1_0_00000001 local_1b9;
  NullCallback local_1b8;
  anon_class_1_0_00000001 local_191;
  NullCallback local_190;
  anon_class_1_0_00000001 local_169;
  NullCallback local_168;
  anon_class_1_0_00000001 local_141;
  NullCallback local_140;
  anon_class_1_0_00000001 local_119;
  Callback local_118;
  anon_class_1_0_00000001 local_f1;
  Callback local_f0;
  anon_class_1_0_00000001 local_c9;
  NullCallback local_c8;
  undefined1 local_a8 [8];
  OptionParser parser;
  char **argv_local;
  int argc_local;
  
  parser.on_error_._M_invoker = (_Invoker_type)argv;
  wabt::OptionParser::OptionParser
            ((OptionParser *)local_a8,"wasm-interp",
             "  read a file in the wasm binary format, and run in it a stack-based\n  interpreter.\n\nexamples:\n  # parse binary file test.wasm, and type-check it\n  $ wasm-interp test.wasm\n\n  # parse test.wasm and run all its exported functions\n  $ wasm-interp test.wasm --run-all-exports\n\n  # parse test.wasm, run the exported functions and trace the output\n  $ wasm-interp test.wasm --run-all-exports --trace\n\n  # parse test.wasm and run all its exported functions, setting the\n  # value stack size to 100 elements\n  $ wasm-interp test.wasm -V 100 --run-all-exports\n"
            );
  std::function<void()>::function<ParseOptions(int,char**)::__0,void>
            ((function<void()> *)&local_c8,&local_c9);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,'v',"verbose","Use multiple times for more info",&local_c8);
  std::function<void_()>::~function(&local_c8);
  wabt::Features::AddOptions(&s_features,(OptionParser *)local_a8);
  std::function<void(char_const*)>::function<ParseOptions(int,char**)::__1,void>
            ((function<void(char_const*)> *)&local_f0,&local_f1);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,'V',"value-stack-size","SIZE",
             "Size in elements of the value stack",&local_f0);
  std::function<void_(const_char_*)>::~function(&local_f0);
  std::function<void(char_const*)>::function<ParseOptions(int,char**)::__2,void>
            ((function<void(char_const*)> *)&local_118,&local_119);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,'C',"call-stack-size","SIZE",
             "Size in elements of the call stack",&local_118);
  std::function<void_(const_char_*)>::~function(&local_118);
  std::function<void()>::function<ParseOptions(int,char**)::__3,void>
            ((function<void()> *)&local_140,&local_141);
  wabt::OptionParser::AddOption((OptionParser *)local_a8,'t',"trace","Trace execution",&local_140);
  std::function<void_()>::~function(&local_140);
  std::function<void()>::function<ParseOptions(int,char**)::__4,void>
            ((function<void()> *)&local_168,&local_169);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,"run-all-exports",
             "Run all the exported functions, in order. Useful for testing",&local_168);
  std::function<void_()>::~function(&local_168);
  std::function<void()>::function<ParseOptions(int,char**)::__5,void>
            ((function<void()> *)&local_190,&local_191);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,"host-print",
             "Include an importable function named \"host.print\" for printing to stdout",&local_190
            );
  std::function<void_()>::~function(&local_190);
  std::function<void()>::function<ParseOptions(int,char**)::__6,void>
            ((function<void()> *)&local_1b8,&local_1b9);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,"dummy-import-func",
             "Provide a dummy implementation of all imported functions. The function will log the call and return an appropriate zero value."
             ,&local_1b8);
  std::function<void_()>::~function(&local_1b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e0,"filename",&local_1e1);
  std::function<void(char_const*)>::function<ParseOptions(int,char**)::__7,void>
            ((function<void(char_const*)> *)&local_208,&local_209);
  wabt::OptionParser::AddArgument((OptionParser *)local_a8,&local_1e0,One,&local_208);
  std::function<void_(const_char_*)>::~function(&local_208);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  wabt::OptionParser::Parse((OptionParser *)local_a8,argc,(char **)parser.on_error_._M_invoker);
  wabt::OptionParser::~OptionParser((OptionParser *)local_a8);
  return;
}

Assistant:

static void ParseOptions(int argc, char** argv) {
  OptionParser parser("wasm-interp", s_description);

  parser.AddOption('v', "verbose", "Use multiple times for more info", []() {
    s_verbose++;
    s_log_stream = FileStream::CreateStdout();
  });
  s_features.AddOptions(&parser);
  parser.AddOption('V', "value-stack-size", "SIZE",
                   "Size in elements of the value stack",
                   [](const std::string& argument) {
                     // TODO(binji): validate.
                     s_thread_options.value_stack_size = atoi(argument.c_str());
                   });
  parser.AddOption('C', "call-stack-size", "SIZE",
                   "Size in elements of the call stack",
                   [](const std::string& argument) {
                     // TODO(binji): validate.
                     s_thread_options.call_stack_size = atoi(argument.c_str());
                   });
  parser.AddOption('t', "trace", "Trace execution",
                   []() { s_trace_stream = s_stdout_stream.get(); });
  parser.AddOption(
      "run-all-exports",
      "Run all the exported functions, in order. Useful for testing",
      []() { s_run_all_exports = true; });
  parser.AddOption("host-print",
                   "Include an importable function named \"host.print\" for "
                   "printing to stdout",
                   []() { s_host_print = true; });
  parser.AddOption(
      "dummy-import-func",
      "Provide a dummy implementation of all imported functions. The function "
      "will log the call and return an appropriate zero value.",
      []() { s_dummy_import_func = true; });

  parser.AddArgument("filename", OptionParser::ArgumentCount::One,
                     [](const char* argument) { s_infile = argument; });
  parser.Parse(argc, argv);
}